

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseAttValueInternal
                    (xmlParserCtxtPtr ctxt,int *attlen,int *alloc,int normalize,int isNamespace)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  xmlParserInputPtr pxVar7;
  xmlChar *pxVar8;
  xmlEntityPtr pent;
  uint uVar9;
  char *str;
  ulong uVar10;
  byte *pbVar11;
  xmlSBuf buf;
  int local_70;
  int local_6c;
  xmlSBuf local_68;
  uint *local_48;
  int *local_40;
  uint local_34;
  
  local_68.max = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    local_68.max = 10000000;
  }
  iVar3 = ctxt->replaceEntities;
  local_68.mem = (xmlChar *)0x0;
  local_68.size = 0;
  local_68.cap = 0;
  local_68.code = XML_ERR_OK;
  pxVar7 = ctxt->input;
  local_6c = normalize;
  if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar7 = ctxt->input;
  }
  bVar1 = *pxVar7->cur;
  if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
    pxVar7->col = pxVar7->col + 1;
    pxVar7->cur = pxVar7->cur + 1;
    local_70 = 1;
    local_48 = (uint *)attlen;
    local_40 = alloc;
    if (ctxt->disableSAX < 2) {
      local_34 = (uint)(ctxt->inSubset != 0) * 2 | 0xfffffff9;
      uVar10 = 0;
      do {
        pxVar7 = ctxt->input;
        pbVar11 = pxVar7->cur;
        if (pxVar7->end <= pbVar11) {
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ATTRIBUTE_NOT_FINISHED,
                     XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                     "AttValue: \' expected\n");
          break;
        }
        if (((long)pxVar7->end - (long)pbVar11 < 10) && ((pxVar7->flags & 0x40) == 0)) {
          xmlParserGrow(ctxt);
          pbVar11 = ctxt->input->cur;
        }
        bVar2 = *pbVar11;
        uVar6 = (uint)uVar10;
        if ((char)bVar2 < '\0') {
          iVar5 = xmlUTF8MultibyteLen(ctxt,pbVar11,"invalid character in attribute value\n");
          if (iVar5 == 0) {
            if (0 < (int)uVar6) {
              xmlSBufAddString(&local_68,ctxt->input->cur + -uVar10,uVar6);
              uVar10 = 0;
            }
            xmlSBufAddString(&local_68,(xmlChar *)anon_var_dwarf_11f0c,3);
            pxVar7 = ctxt->input;
            if (*pxVar7->cur == '\n') {
              pxVar7->line = pxVar7->line + 1;
              pxVar7->col = 1;
            }
            else {
              pxVar7->col = pxVar7->col + 1;
            }
            pxVar7->cur = pxVar7->cur + 1;
          }
          else {
            pxVar7 = ctxt->input;
            if (*pxVar7->cur == '\n') {
              pxVar7->line = pxVar7->line + 1;
              pxVar7->col = 1;
            }
            else {
              pxVar7->col = pxVar7->col + 1;
            }
            uVar10 = (ulong)(uVar6 + iVar5);
            pxVar7->cur = pxVar7->cur + iVar5;
          }
LAB_00135cc0:
          local_70 = 0;
        }
        else {
          uVar9 = (uint)bVar2;
          if (uVar9 == 0x26) {
            if (pbVar11[1] == 0x23) {
              if (0 < (int)uVar6) {
                xmlSBufAddString(&local_68,pbVar11 + -uVar10,uVar6);
                uVar10 = 0;
              }
              iVar5 = xmlParseCharRef(ctxt);
              if (iVar5 == 0) break;
              if (iVar5 == 0x26 && (isNamespace == 0 && iVar3 == 0)) {
LAB_00135c7e:
                str = "&#38;";
                uVar6 = 5;
                goto LAB_00135c8f;
              }
              if (iVar5 != 0x20) {
                xmlSBufAddChar(&local_68,iVar5);
                goto LAB_00135cc0;
              }
              if ((local_6c == 0) || (local_70 == 0)) {
                xmlSBufAddString(&local_68," ",1);
              }
              local_70 = 1;
            }
            else {
              if (0 < (int)uVar6) {
                xmlSBufAddString(&local_68,pbVar11 + -uVar10,uVar6);
                uVar10 = 0;
              }
              pxVar8 = xmlParseEntityRefInternal(ctxt);
              if ((pxVar8 != (xmlChar *)0x0) &&
                 (pent = xmlLookupGeneralEntity(ctxt,pxVar8,1), pent != (xmlEntityPtr)0x0)) {
                if (pent->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                  str = (char *)pent->content;
                  if (*str == '&' && (isNamespace == 0 && iVar3 == 0)) goto LAB_00135c7e;
                  uVar6 = pent->length;
                }
                else {
                  if (isNamespace != 0 || iVar3 != 0) {
                    xmlExpandEntityInAttValue
                              (ctxt,&local_68,pent->content,pent,local_6c,&local_70,ctxt->inputNr,1)
                    ;
                    goto LAB_00135d43;
                  }
                  if ((pent->flags | local_34) != 0xffffffff) {
                    xmlCheckEntityInAttValue(ctxt,pent,ctxt->inputNr);
                  }
                  iVar5 = xmlParserEntityCheck(ctxt,pent->expandedSize);
                  if (iVar5 != 0) {
                    *pent->content = '\0';
                    break;
                  }
                  xmlSBufAddString(&local_68,(xmlChar *)"&",1);
                  pxVar8 = pent->name;
                  uVar6 = xmlStrlen(pxVar8);
                  xmlSBufAddString(&local_68,pxVar8,uVar6);
                  str = ";";
                  uVar6 = 1;
                }
LAB_00135c8f:
                xmlSBufAddString(&local_68,(xmlChar *)str,uVar6);
                goto LAB_00135cc0;
              }
            }
          }
          else {
            if (bVar2 < 0x21) {
              if ((0x20 < uVar9) || ((0x100002600U >> ((ulong)uVar9 & 0x3f) & 1) == 0)) {
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,
                           (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                           "invalid character in attribute value\n");
                if (0 < (int)uVar6) {
                  xmlSBufAddString(&local_68,ctxt->input->cur + -uVar10,uVar6);
                  uVar10 = 0;
                }
                xmlSBufAddString(&local_68,(xmlChar *)anon_var_dwarf_11f0c,3);
                goto LAB_00135b37;
              }
              if ((local_6c == 0) || (local_70 == 0)) {
                if (uVar9 != 0x20) {
                  if (0 < (int)uVar6) {
                    xmlSBufAddString(&local_68,pbVar11 + -uVar10,uVar6);
                    uVar10 = 0;
                  }
                  xmlSBufAddString(&local_68," ",1);
                  goto LAB_00135cfe;
                }
                uVar10 = (ulong)(uVar6 + 1);
                local_70 = 1;
              }
              else {
                if (0 < (int)uVar6) {
                  xmlSBufAddString(&local_68,pbVar11 + -uVar10,uVar6);
                  uVar10 = 0;
                }
LAB_00135cfe:
                local_70 = 1;
                if (bVar2 == 0xd) {
                  pxVar8 = ctxt->input->cur;
                  if (pxVar8[1] == '\n') {
                    ctxt->input->cur = pxVar8 + 1;
                  }
                }
              }
            }
            else {
              if (bVar2 == bVar1) {
                if ((local_40 == (int *)0x0) || (local_68.mem != (xmlChar *)0x0)) {
                  if (0 < (int)uVar6) {
                    xmlSBufAddString(&local_68,pbVar11 + -uVar10,uVar6);
                  }
                  puVar4 = local_48;
                  if (local_68.size != 0 && (local_70 != 0 && local_6c != 0)) {
                    local_68.size = local_68.size - 1;
                  }
                  pbVar11 = xmlSBufFinish(&local_68,(int *)local_48,ctxt,"AttValue length too long")
                  ;
                  if (pbVar11 == (byte *)0x0) {
                    pbVar11 = (byte *)0x0;
                  }
                  else {
                    if (puVar4 != (uint *)0x0) {
                      *puVar4 = local_68.size;
                    }
                    if (local_40 != (int *)0x0) {
                      *local_40 = 1;
                    }
                  }
                }
                else {
                  if (local_48 != (uint *)0x0) {
                    *local_48 = uVar6;
                  }
                  if (((local_6c != 0) && (local_70 != 0)) && (0 < (int)uVar6)) {
                    *local_48 = *local_48 - 1;
                  }
                  pbVar11 = pbVar11 + -(long)(int)uVar6;
                  *local_40 = 0;
                  xmlSBufCleanup(&local_68,ctxt,"AttValue length too long");
                }
                pxVar7 = ctxt->input;
                if (*pxVar7->cur == '\n') {
                  pxVar7->line = pxVar7->line + 1;
                  pxVar7->col = 1;
                }
                else {
                  pxVar7->col = pxVar7->col + 1;
                }
                pxVar7->cur = pxVar7->cur + 1;
                return pbVar11;
              }
              if (bVar2 == 0x3c) {
                xmlFatalErr(ctxt,XML_ERR_LT_IN_ATTRIBUTE,(char *)0x0);
              }
              uVar10 = (ulong)(uVar6 + 1);
LAB_00135b37:
              local_70 = 0;
            }
            pxVar7 = ctxt->input;
            if (*pxVar7->cur == '\n') {
              pxVar7->line = pxVar7->line + 1;
              pxVar7->col = 1;
            }
            else {
              pxVar7->col = pxVar7->col + 1;
            }
            pxVar7->cur = pxVar7->cur + 1;
          }
        }
LAB_00135d43:
      } while (ctxt->disableSAX < 2);
    }
    xmlSBufCleanup(&local_68,ctxt,"AttValue length too long");
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlParseAttValueInternal(xmlParserCtxtPtr ctxt, int *attlen, int *alloc,
                         int normalize, int isNamespace) {
    unsigned maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                         XML_MAX_HUGE_LENGTH :
                         XML_MAX_TEXT_LENGTH;
    xmlSBuf buf;
    xmlChar *ret;
    int c, l, quote, flags, chunkSize;
    int inSpace = 1;
    int replaceEntities;

    /* Always expand namespace URIs */
    replaceEntities = (ctxt->replaceEntities) || (isNamespace);

    xmlSBufInit(&buf, maxLength);

    GROW;

    quote = CUR;
    if ((quote != '"') && (quote != '\'')) {
	xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
	return(NULL);
    }
    NEXTL(1);

    if (ctxt->inSubset == 0)
        flags = XML_ENT_CHECKED | XML_ENT_VALIDATED;
    else
        flags = XML_ENT_VALIDATED;

    inSpace = 1;
    chunkSize = 0;

    while (1) {
        if (PARSER_STOPPED(ctxt))
            goto error;

        if (CUR_PTR >= ctxt->input->end) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue: ' expected\n");
            goto error;
        }

        /*
         * TODO: Check growth threshold
         */
        if (ctxt->input->end - CUR_PTR < 10)
            GROW;

        c = CUR;

        if (c >= 0x80) {
            l = xmlUTF8MultibyteLen(ctxt, CUR_PTR,
                    "invalid character in attribute value\n");
            if (l == 0) {
                if (chunkSize > 0) {
                    xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                    chunkSize = 0;
                }
                xmlSBufAddReplChar(&buf);
                NEXTL(1);
            } else {
                chunkSize += l;
                NEXTL(l);
            }

            inSpace = 0;
        } else if (c != '&') {
            if (c > 0x20) {
                if (c == quote)
                    break;

                if (c == '<')
                    xmlFatalErr(ctxt, XML_ERR_LT_IN_ATTRIBUTE, NULL);

                chunkSize += 1;
                inSpace = 0;
            } else if (!IS_BYTE_CHAR(c)) {
                xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                        "invalid character in attribute value\n");
                if (chunkSize > 0) {
                    xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                    chunkSize = 0;
                }
                xmlSBufAddReplChar(&buf);
                inSpace = 0;
            } else {
                /* Whitespace */
                if ((normalize) && (inSpace)) {
                    /* Skip char */
                    if (chunkSize > 0) {
                        xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                        chunkSize = 0;
                    }
                } else if (c < 0x20) {
                    /* Convert to space */
                    if (chunkSize > 0) {
                        xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                        chunkSize = 0;
                    }

                    xmlSBufAddCString(&buf, " ", 1);
                } else {
                    chunkSize += 1;
                }

                inSpace = 1;

                if ((c == 0xD) && (NXT(1) == 0xA))
                    CUR_PTR++;
            }

            NEXTL(1);
        } else if (NXT(1) == '#') {
            int val;

            if (chunkSize > 0) {
                xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                chunkSize = 0;
            }

            val = xmlParseCharRef(ctxt);
            if (val == 0)
                goto error;

            if ((val == '&') && (!replaceEntities)) {
                /*
                 * The reparsing will be done in xmlNodeParseContent()
                 * called from SAX2.c
                 */
                xmlSBufAddCString(&buf, "&#38;", 5);
                inSpace = 0;
            } else if (val == ' ') {
                if ((!normalize) || (!inSpace))
                    xmlSBufAddCString(&buf, " ", 1);
                inSpace = 1;
            } else {
                xmlSBufAddChar(&buf, val);
                inSpace = 0;
            }
        } else {
            const xmlChar *name;
            xmlEntityPtr ent;

            if (chunkSize > 0) {
                xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);
                chunkSize = 0;
            }

            name = xmlParseEntityRefInternal(ctxt);
            if (name == NULL) {
                /*
                 * Probably a literal '&' which wasn't escaped.
                 * TODO: Handle gracefully in recovery mode.
                 */
                continue;
            }

            ent = xmlLookupGeneralEntity(ctxt, name, /* isAttr */ 1);
            if (ent == NULL)
                continue;

            if (ent->etype == XML_INTERNAL_PREDEFINED_ENTITY) {
                if ((ent->content[0] == '&') && (!replaceEntities))
                    xmlSBufAddCString(&buf, "&#38;", 5);
                else
                    xmlSBufAddString(&buf, ent->content, ent->length);
                inSpace = 0;
            } else if (replaceEntities) {
                xmlExpandEntityInAttValue(ctxt, &buf, ent->content, ent,
                                          normalize, &inSpace, ctxt->inputNr,
                                          /* check */ 1);
            } else {
                if ((ent->flags & flags) != flags)
                    xmlCheckEntityInAttValue(ctxt, ent, ctxt->inputNr);

                if (xmlParserEntityCheck(ctxt, ent->expandedSize)) {
                    ent->content[0] = 0;
                    goto error;
                }

                /*
                 * Just output the reference
                 */
                xmlSBufAddCString(&buf, "&", 1);
                xmlSBufAddString(&buf, ent->name, xmlStrlen(ent->name));
                xmlSBufAddCString(&buf, ";", 1);

                inSpace = 0;
            }
	}
    }

    if ((buf.mem == NULL) && (alloc != NULL)) {
        ret = (xmlChar *) CUR_PTR - chunkSize;

        if (attlen != NULL)
            *attlen = chunkSize;
        if ((normalize) && (inSpace) && (chunkSize > 0))
            *attlen -= 1;
        *alloc = 0;

        /* Report potential error */
        xmlSBufCleanup(&buf, ctxt, "AttValue length too long");
    } else {
        if (chunkSize > 0)
            xmlSBufAddString(&buf, CUR_PTR - chunkSize, chunkSize);

        if ((normalize) && (inSpace) && (buf.size > 0))
            buf.size--;

        ret = xmlSBufFinish(&buf, attlen, ctxt, "AttValue length too long");

        if (ret != NULL) {
            if (attlen != NULL)
                *attlen = buf.size;
            if (alloc != NULL)
                *alloc = 1;
        }
    }

    NEXTL(1);

    return(ret);

error:
    xmlSBufCleanup(&buf, ctxt, "AttValue length too long");
    return(NULL);
}